

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
vkt::shaderexecutor::Functions::GetComponent<tcu::Vector<float,_2>_>::doApply
          (IRet *__return_storage_ptr__,GetComponent<tcu::Vector<float,_2>_> *this,
          EvalContext *param_1,IArgs *iargs)

{
  double *pdVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  
  dVar11 = INFINITY;
  dVar12 = -INFINITY;
  lVar8 = 0;
  uVar7 = 0;
  bVar5 = true;
  do {
    bVar6 = bVar5;
    if ((iargs->b->m_lo <= (double)(int)lVar8) && ((double)(int)lVar8 <= iargs->b->m_hi)) {
      uVar2 = uVar7 & 1;
      uVar7 = 1;
      if (uVar2 == 0) {
        uVar7 = *(uint *)(iargs->a->m_data + lVar8);
      }
      pdVar1 = &iargs->a->m_data[lVar8].m_lo;
      dVar3 = *pdVar1;
      dVar4 = pdVar1[1];
      uVar9 = -(ulong)(dVar11 <= dVar3);
      uVar10 = -(ulong)(dVar4 <= dVar12);
      dVar11 = (double)((ulong)dVar11 & uVar9 | ~uVar9 & (ulong)dVar3);
      dVar12 = (double)((ulong)dVar12 & uVar10 | ~uVar10 & (ulong)dVar4);
    }
    lVar8 = 1;
    bVar5 = false;
  } while (bVar6);
  __return_storage_ptr__->m_hasNaN = SUB41(uVar7,0);
  __return_storage_ptr__->m_lo = dVar11;
  __return_storage_ptr__->m_hi = dVar12;
  return __return_storage_ptr__;
}

Assistant:

IRet		doApply		(const EvalContext&,
							 const typename GetComponent::IArgs& iargs) const
	{
		IRet ret;

		for (int compNdx = 0; compNdx < T::SIZE; ++compNdx)
		{
			if (iargs.b.contains(compNdx))
				ret = unionIVal<typename T::Element>(ret, iargs.a[compNdx]);
		}

		return ret;
	}